

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O3

void __thiscall FScriptLoader::ParseInfoCmd(FScriptLoader *this,char *line,FString *scriptsrc)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  FString *pFVar6;
  char *pcVar7;
  char cVar8;
  FScanner sc;
  FScanner local_118;
  
  cVar8 = *line;
  if (cVar8 != '\0') {
    pcVar4 = line + 1;
    do {
      if (cVar8 < ' ') {
        pcVar4[-1] = ' ';
      }
      cVar8 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar8 != '\0');
  }
  if (this->readtype == RT_SCRIPT) {
    bVar1 = *line;
LAB_0050d046:
    if (bVar1 == 0x5b) {
      iVar3 = strncasecmp((char *)((byte *)line + 1),"scripts",7);
      if (iVar3 == 0) {
        this->readtype = RT_SCRIPT;
        this->HasScripts = true;
        return;
      }
      iVar3 = strncasecmp((char *)((byte *)line + 1),"level info",10);
      if (iVar3 != 0) {
        return;
      }
      this->readtype = RT_INFO;
      return;
    }
  }
  else {
    sVar5 = strlen(line);
    if (line[sVar5 - 1] == ' ') {
      pcVar4 = line + sVar5;
      do {
        pcVar4[-1] = '\0';
        pcVar7 = pcVar4 + -2;
        pcVar4 = pcVar4 + -1;
      } while (*pcVar7 == ' ');
    }
    for (; bVar1 = *line, bVar1 == 0x20; line = (char *)((byte *)line + 1)) {
    }
    if (bVar1 < 0x2f) {
      if (bVar1 == 0) {
        return;
      }
      if (bVar1 == 0x23) {
        return;
      }
      goto LAB_0050d046;
    }
    if (bVar1 != 0x2f) {
      if (bVar1 == 0x3b) {
        return;
      }
      goto LAB_0050d046;
    }
    if (((byte *)line)[1] == 0x2f) {
      return;
    }
  }
  if (this->readtype != RT_INFO) {
    if (this->readtype != RT_SCRIPT) {
      return;
    }
    pFVar6 = FString::operator+=(scriptsrc,line);
    FString::operator+=(pFVar6,'\n');
    return;
  }
  FScanner::FScanner(&local_118);
  sVar5 = strlen(line);
  FScanner::OpenMem(&local_118,"LEVELINFO",line,(int)sVar5);
  FScanner::SetCMode(&local_118,true);
  FScanner::MustGetString(&local_118);
  bVar2 = FScanner::Compare(&local_118,"levelname");
  if (bVar2) {
    pcVar4 = strchr(line,0x3d);
    do {
      pcVar7 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    } while (*pcVar7 < '!');
    pcVar7 = strstr(pcVar4,"//");
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    FString::operator=(&level.LevelName,pcVar4);
  }
  else {
    bVar2 = FScanner::Compare(&local_118,"partime");
    if (bVar2) {
      FScanner::MustGetStringName(&local_118,"=");
      FScanner::MustGetNumber(&local_118);
      level.partime = local_118.Number;
    }
    else {
      bVar2 = FScanner::Compare(&local_118,"music");
      if (bVar2) {
        FScanner::MustGetStringName(&local_118,"=");
        FScanner::MustGetString(&local_118);
        bVar2 = FS_ChangeMusic(local_118.String);
        if (!bVar2) {
          S_ChangeMusic(level.Music.Chars,level.musicorder,true,false);
        }
      }
      else {
        bVar2 = FScanner::Compare(&local_118,"skyname");
        if (bVar2) {
          FScanner::MustGetStringName(&local_118,"=");
          FScanner::MustGetString(&local_118);
          sky1texture = FTextureManager::GetTexture(&TexMan,local_118.String,1,6);
          sky2texture.texnum = sky1texture.texnum;
          level.skytexture1 = sky1texture;
          level.skytexture2 = sky1texture;
          R_InitSkyMap();
        }
        else {
          bVar2 = FScanner::Compare(&local_118,"interpic");
          if (bVar2) {
            FScanner::MustGetStringName(&local_118,"=");
            FScanner::MustGetString(&local_118);
            pFVar6 = &(level.info)->ExitPic;
          }
          else {
            bVar2 = FScanner::Compare(&local_118,"gravity");
            if (bVar2) {
              FScanner::MustGetStringName(&local_118,"=");
              FScanner::MustGetNumber(&local_118);
              level.gravity = (double)((float)local_118.Number * 8.0);
              goto LAB_0050d1b7;
            }
            bVar2 = FScanner::Compare(&local_118,"nextlevel");
            if (bVar2) {
              FScanner::MustGetStringName(&local_118,"=");
              FScanner::MustGetString(&local_118);
              pFVar6 = &level.NextMap;
            }
            else {
              bVar2 = FScanner::Compare(&local_118,"nextsecret");
              if (!bVar2) {
                bVar2 = FScanner::Compare(&local_118,"drown");
                if (bVar2) {
                  FScanner::MustGetStringName(&local_118,"=");
                  FScanner::MustGetNumber(&local_118);
                  this->drownflag = (uint)(local_118.Number != 0);
                }
                else {
                  bVar2 = FScanner::Compare(&local_118,"consolecmd");
                  if (bVar2) {
                    pcVar4 = strchr(line,0x3d);
                    do {
                      pcVar7 = pcVar4 + 1;
                      pcVar4 = pcVar4 + 1;
                    } while (*pcVar7 < ' ');
                    pcVar7 = strstr(pcVar4,"//");
                    if (pcVar7 != (char *)0x0) {
                      *pcVar7 = '\0';
                    }
                    FS_EmulateCmd(pcVar4);
                  }
                  else {
                    bVar2 = FScanner::Compare(&local_118,"ignore");
                    if (bVar2) {
                      FScanner::MustGetStringName(&local_118,"=");
                      FScanner::MustGetNumber(&local_118);
                      this->IgnoreInfo = local_118.Number != 0;
                    }
                  }
                }
                goto LAB_0050d1b7;
              }
              FScanner::MustGetStringName(&local_118,"=");
              FScanner::MustGetString(&local_118);
              pFVar6 = &level.NextSecretMap;
            }
          }
          FString::operator=(pFVar6,local_118.String);
        }
      }
    }
  }
LAB_0050d1b7:
  FScanner::Close(&local_118);
  FScanner::~FScanner(&local_118);
  return;
}

Assistant:

void FScriptLoader::ParseInfoCmd(char *line, FString &scriptsrc)
{
	char *temp;
	
	// clear any control chars
	for(temp=line; *temp; temp++) if (*temp<32) *temp=32;

	if(readtype != RT_SCRIPT)       // not for scripts
	{
		temp = line+strlen(line)-1;

		// strip spaces at the beginning and end of the line
		while(*temp == ' ')	*temp-- = 0;
		while(*line == ' ') line++;
		
		if(!*line) return;
		
		if((line[0] == '/' && line[1] == '/') ||     // comment
			line[0] == '#' || line[0] == ';') return;
	}
	
	if(*line == '[')                // a new section seperator
	{
		line++;
		
		if(!strnicmp(line, "scripts", 7))
		{
			readtype = RT_SCRIPT;
			HasScripts = true;    // has scripts
		}
		else if (!strnicmp(line, "level info", 10))
		{
			readtype = RT_INFO;
		}
		return;
	}
	
	if (readtype==RT_SCRIPT)
	{
		scriptsrc << line << '\n';
	}
	else if (readtype==RT_INFO)
	{
		// Read the usable parts of the level info header 
		// and ignore the rest.
		FScanner sc;
		sc.OpenMem("LEVELINFO", line, (int)strlen(line));
		sc.SetCMode(true);
		sc.MustGetString();
		if (sc.Compare("levelname"))
		{
			char * beg = strchr(line, '=')+1;
			while (*beg<=' ') beg++;
			char * comm = strstr(beg, "//");
			if (comm) *comm=0;
			level.LevelName = beg;
		}
		else if (sc.Compare("partime"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			level.partime=sc.Number;
		}
		else if (sc.Compare("music"))
		{
			bool FS_ChangeMusic(const char * string);

			sc.MustGetStringName("=");
			sc.MustGetString();
			if (!FS_ChangeMusic(sc.String))
			{
				S_ChangeMusic(level.Music, level.musicorder);
			}
		}
		else if (sc.Compare("skyname"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
		
			sky2texture = sky1texture = level.skytexture1 = level.skytexture2 = TexMan.GetTexture (sc.String, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_ReturnFirst);
			R_InitSkyMap ();
		}
		else if (sc.Compare("interpic"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.info->ExitPic = sc.String;
		}
		else if (sc.Compare("gravity"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			level.gravity=sc.Number*8.f;
		}
		else if (sc.Compare("nextlevel"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.NextMap = sc.String;
		}
		else if (sc.Compare("nextsecret"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.NextSecretMap = sc.String;
		}
		else if (sc.Compare("drown"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			drownflag=!!sc.Number;
		}
		else if (sc.Compare("consolecmd"))
		{
			char * beg = strchr(line, '=')+1;
			while (*beg<' ') beg++;
			char * comm = strstr(beg, "//");
			if (comm) *comm=0;
			FS_EmulateCmd(beg);
		}
		else if (sc.Compare("ignore"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			IgnoreInfo=!!sc.Number;
		}
		// Ignore anything unknows
		sc.Close();
	}
}